

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O0

bool __thiscall
booster::aio::event_loop_impl::io_event_canceler::cancelation_is_needed_with_data_mutex_locked
          (io_event_canceler *this)

{
  bool bVar1;
  io_data *piVar2;
  socket_map<booster::aio::event_loop_impl::io_data> *in_RDI;
  io_data *cont;
  native_type in_stack_ffffffffffffffdc;
  
  bVar1 = std::
          deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ::empty((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                   *)0x20afd0);
  if ((((bVar1) &&
       (piVar2 = socket_map<booster::aio::event_loop_impl::io_data>::operator[]
                           (in_RDI,in_stack_ffffffffffffffdc), piVar2->current_event == 0)) &&
      (bVar1 = callback::operator_cast_to_bool((callback<void_(const_std::error_code_&)> *)0x20b00c)
      , !bVar1)) &&
     (bVar1 = callback::operator_cast_to_bool((callback<void_(const_std::error_code_&)> *)0x20b01e),
     !bVar1)) {
    socket_map<booster::aio::event_loop_impl::io_data>::erase
              ((socket_map<booster::aio::event_loop_impl::io_data> *)
               &(in_RDI->map_).
                super__Vector_base<booster::aio::event_loop_impl::io_data,_std::allocator<booster::aio::event_loop_impl::io_data>_>
                ._M_impl.super__Vector_impl_data._M_finish[2].writeable,
               *(native_type *)
                &(in_RDI->map_).
                 super__Vector_base<booster::aio::event_loop_impl::io_data,_std::allocator<booster::aio::event_loop_impl::io_data>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    return false;
  }
  return true;
}

Assistant:

bool cancelation_is_needed_with_data_mutex_locked()
		{
			if(!self_->dispatch_queue_.empty())
				return true;
			io_data &cont=self_->map_[fd];
			if(cont.current_event == 0 && !cont.readable && !cont.writeable) {
				self_->map_.erase(fd);
				return false;
			}
			return true;
		}